

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateBaseClass.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::DynamicState::DynamicStateBaseClass::iterate
          (TestStatus *__return_storage_ptr__,DynamicStateBaseClass *this)

{
  allocator<char> local_39;
  string local_38;
  DynamicStateBaseClass *local_18;
  DynamicStateBaseClass *this_local;
  
  local_18 = this;
  this_local = (DynamicStateBaseClass *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Implement iterate() method!",&local_39);
  tcu::TestStatus::fail(__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus DynamicStateBaseClass::iterate (void)
{
	DE_ASSERT(false);
	return tcu::TestStatus::fail("Implement iterate() method!");
}